

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddRect(ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col,float rounding,
                   ImDrawCornerFlags rounding_corners,float thickness)

{
  float fVar1;
  ImVec2 local_20;
  ImVec2 local_18;
  
  if (0xffffff < col) {
    if ((this->Flags & 1) == 0) {
      local_18.y = p_min->y + 0.5;
      local_18.x = p_min->x + 0.5;
      fVar1 = -0.49;
    }
    else {
      local_18.y = p_min->y + 0.5;
      local_18.x = p_min->x + 0.5;
      fVar1 = -0.5;
    }
    local_20.y = fVar1 + p_max->y;
    local_20.x = p_max->x + fVar1;
    PathRect(this,&local_18,&local_20,rounding,rounding_corners);
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,true,thickness);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddRect(const ImVec2& p_min, const ImVec2& p_max, ImU32 col, float rounding, ImDrawCornerFlags rounding_corners, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
        PathRect(p_min + ImVec2(0.50f,0.50f), p_max - ImVec2(0.50f,0.50f), rounding, rounding_corners);
    else
        PathRect(p_min + ImVec2(0.50f,0.50f), p_max - ImVec2(0.49f,0.49f), rounding, rounding_corners); // Better looking lower-right corner and rounded non-AA shapes.
    PathStroke(col, true, thickness);
}